

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O3

void __thiscall Pl_QPDFTokenizer::~Pl_QPDFTokenizer(Pl_QPDFTokenizer *this)

{
  ~Pl_QPDFTokenizer(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_QPDFTokenizer::~Pl_QPDFTokenizer() = default;